

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

path * boost::filesystem::detail::canonical
                 (path *__return_storage_ptr__,path *p,path *base,error_code *ec)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  error_category *peVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  path *ppVar6;
  filesystem_error *pfVar7;
  bool bVar8;
  error_code ec_00;
  error_code ec_01;
  path result;
  iterator itr;
  path source;
  path link;
  error_code local_resd8;
  path new_source;
  file_status stat;
  path root;
  path local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  iterator local_130;
  path local_100;
  long *local_e0;
  long local_d0 [2];
  path *local_c0;
  size_type local_b8;
  path local_b0;
  error_code local_90;
  long *local_80 [2];
  long local_70 [2];
  int local_60 [2];
  int local_58 [2];
  path local_50;
  
  bVar2 = path::has_root_directory(p);
  if (bVar2) {
    local_100.m_pathname._M_dataplus._M_p = (pointer)&local_100.m_pathname.field_2;
    pcVar1 = (p->m_pathname)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,pcVar1,pcVar1 + (p->m_pathname)._M_string_length);
  }
  else {
    absolute(&local_100,p,base);
  }
  path::root_path(&local_50,&local_100);
  local_158.m_pathname._M_dataplus._M_p = (pointer)&local_158.m_pathname.field_2;
  local_158.m_pathname._M_string_length = 0;
  local_158.m_pathname.field_2._M_local_buf[0] = '\0';
  local_90.m_val = 0;
  local_90.m_cat = system::system_category();
  status((detail *)local_58,&local_100,&local_90);
  if (local_58[0] == 1) {
    if (ec == (error_code *)0x0) {
      pfVar7 = (filesystem_error *)__cxa_allocate_exception(0x50);
      local_130.m_element.m_pathname._M_dataplus._M_p =
           (pointer)&local_130.m_element.m_pathname.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"boost::filesystem::canonical","");
      peVar4 = system::generic_category();
      ec_00.m_cat = peVar4;
      ec_00._0_8_ = 2;
      filesystem_error::filesystem_error(pfVar7,(string *)&local_130,&local_100,ec_00);
      __cxa_throw(pfVar7,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
    peVar4 = system::generic_category();
    ec->m_val = 2;
    ec->m_cat = peVar4;
  }
  else {
    if (local_90.m_val == 0) {
      local_138 = &(__return_storage_ptr__->m_pathname).field_2;
LAB_0010b199:
      local_158.m_pathname._M_string_length = 0;
      *local_158.m_pathname._M_dataplus._M_p = '\0';
      path::begin(&local_130,&local_100);
      do {
        path::end(&local_100);
        bVar2 = local_b8 == local_130.m_pos;
        bVar8 = local_130.m_path_ptr == local_c0;
        if (local_e0 != local_d0) {
          operator_delete(local_e0,local_d0[0] + 1);
        }
        if (bVar2 && bVar8) {
          bVar2 = true;
LAB_0010b2a2:
          bVar8 = false;
          goto LAB_0010b4ab;
        }
        ppVar6 = dot_path();
        iVar3 = path::compare(&local_130.m_element,ppVar6);
        if (iVar3 != 0) {
          ppVar6 = dot_dot_path();
          iVar3 = path::compare(&local_130.m_element,ppVar6);
          if (iVar3 == 0) {
            iVar3 = path::compare(&local_158,&local_50);
            if (iVar3 != 0) {
              path::remove_filename(&local_158);
            }
          }
          else {
            path::operator/=(&local_158,&local_130.m_element);
            symlink_status((detail *)local_60,&local_158,ec);
            if ((ec != (error_code *)0x0) && (ec->m_val != 0)) {
              (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)local_138;
              (__return_storage_ptr__->m_pathname)._M_string_length = 0;
              (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
              bVar2 = false;
              goto LAB_0010b2a2;
            }
            if (local_60[0] == 4) goto LAB_0010b2a9;
          }
        }
        path::m_path_iterator_increment(&local_130);
      } while( true );
    }
    if (ec == (error_code *)0x0) {
      pfVar7 = (filesystem_error *)__cxa_allocate_exception(0x50);
      local_130.m_element.m_pathname._M_dataplus._M_p =
           (pointer)&local_130.m_element.m_pathname.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"boost::filesystem::canonical","");
      ec_01._4_4_ = 0;
      ec_01.m_val = local_90.m_val;
      ec_01.m_cat = local_90.m_cat;
      filesystem_error::filesystem_error(pfVar7,(string *)&local_130,&local_100,ec_01);
      __cxa_throw(pfVar7,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
    }
    *(ulong *)ec = CONCAT44(local_90._4_4_,local_90.m_val);
    ec->m_cat = local_90.m_cat;
  }
  paVar5 = &(__return_storage_ptr__->m_pathname).field_2;
LAB_0010b0e3:
  (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)paVar5;
  (__return_storage_ptr__->m_pathname)._M_string_length = 0;
  (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_158);
LAB_0010b103:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.m_pathname._M_dataplus._M_p != &local_158.m_pathname.field_2) {
    operator_delete(local_158.m_pathname._M_dataplus._M_p,
                    CONCAT71(local_158.m_pathname.field_2._M_allocated_capacity._1_7_,
                             local_158.m_pathname.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_pathname._M_dataplus._M_p != &local_50.m_pathname.field_2) {
    operator_delete(local_50.m_pathname._M_dataplus._M_p,
                    local_50.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_pathname._M_dataplus._M_p != &local_100.m_pathname.field_2) {
    operator_delete(local_100.m_pathname._M_dataplus._M_p,
                    local_100.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
LAB_0010b2a9:
  read_symlink(&local_b0,&local_158,ec);
  if ((ec == (error_code *)0x0) || (ec->m_val == 0)) {
    path::remove_filename(&local_158);
    bVar2 = path::has_root_directory(&local_b0);
    if (bVar2) {
      path::m_path_iterator_increment(&local_130);
      while( true ) {
        path::end(&local_100);
        bVar2 = local_b8 == local_130.m_pos;
        bVar8 = local_130.m_path_ptr == local_c0;
        if (local_e0 != local_d0) {
          operator_delete(local_e0,local_d0[0] + 1);
        }
        if (bVar2 && bVar8) break;
        path::operator/=(&local_b0,&local_130.m_element);
        path::m_path_iterator_increment(&local_130);
      }
      bVar2 = true;
      std::__cxx11::string::_M_assign((string *)&local_100);
    }
    else {
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,local_158.m_pathname._M_dataplus._M_p,
                 local_158.m_pathname._M_dataplus._M_p + local_158.m_pathname._M_string_length);
      path::operator/=((path *)local_80,&local_b0);
      path::m_path_iterator_increment(&local_130);
      while( true ) {
        path::end(&local_100);
        bVar2 = local_b8 == local_130.m_pos;
        bVar8 = local_130.m_path_ptr == local_c0;
        if (local_e0 != local_d0) {
          operator_delete(local_e0,local_d0[0] + 1);
        }
        if (bVar2 && bVar8) break;
        path::operator/=((path *)local_80,&local_130.m_element);
        path::m_path_iterator_increment(&local_130);
      }
      std::__cxx11::string::_M_assign((string *)&local_100);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      bVar2 = true;
    }
  }
  else {
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)local_138;
    (__return_storage_ptr__->m_pathname)._M_string_length = 0;
    (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
    bVar2 = false;
  }
  bVar8 = bVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_pathname._M_dataplus._M_p != &local_b0.m_pathname.field_2) {
    operator_delete(local_b0.m_pathname._M_dataplus._M_p,
                    local_b0.m_pathname.field_2._M_allocated_capacity + 1);
  }
LAB_0010b4ab:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.m_element.m_pathname._M_dataplus._M_p != &local_130.m_element.m_pathname.field_2)
  {
    operator_delete(local_130.m_element.m_pathname._M_dataplus._M_p,
                    local_130.m_element.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) goto LAB_0010b103;
  if (!bVar8) goto code_r0x0010b4e3;
  goto LAB_0010b199;
code_r0x0010b4e3:
  if (ec != (error_code *)0x0) {
    ec->m_val = 0;
    peVar4 = system::system_category();
    ec->m_cat = peVar4;
  }
  bVar2 = path::has_root_directory(&local_158);
  paVar5 = local_138;
  if (!bVar2) {
    __assert_fail("(result.is_absolute())&&(\"canonical() implementation error; please report\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                  ,0x368,
                  "path boost::filesystem::detail::canonical(const path &, const path &, system::error_code *)"
                 );
  }
  goto LAB_0010b0e3;
}

Assistant:

BOOST_FILESYSTEM_DECL
  path canonical(const path& p, const path& base, system::error_code* ec)
  {
    path source (p.is_absolute() ? p : absolute(p, base));
    path root(source.root_path());
    path result;

    system::error_code local_ec;
    file_status stat (status(source, local_ec));

    if (stat.type() == fs::file_not_found)
    {
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error(
          "boost::filesystem::canonical", source,
          error_code(system::errc::no_such_file_or_directory, system::generic_category())));
      ec->assign(system::errc::no_such_file_or_directory, system::generic_category());
      return result;
    }
    else if (local_ec)
    {
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error(
          "boost::filesystem::canonical", source, local_ec));
      *ec = local_ec;
      return result;
    }

    bool scan (true);
    while (scan)
    {
      scan = false;
      result.clear();
      for (path::iterator itr = source.begin(); itr != source.end(); ++itr)
      {
        if (*itr == dot_path())
          continue;
        if (*itr == dot_dot_path())
        {
          if (result != root)
            result.remove_filename();
          continue;
        }

        result /= *itr;

        bool is_sym (is_symlink(detail::symlink_status(result, ec)));
        if (ec && *ec)
          return path();

        if (is_sym)
        {
          path link(detail::read_symlink(result, ec));
          if (ec && *ec)
            return path();
          result.remove_filename();

          if (link.is_absolute())
          {
            for (++itr; itr != source.end(); ++itr)
              link /= *itr;
            source = link;
          }
          else // link is relative
          {
            path new_source(result);
            new_source /= link;
            for (++itr; itr != source.end(); ++itr)
              new_source /= *itr;
            source = new_source;
          }
          scan = true;  // symlink causes scan to be restarted
          break;
        }
      }
    }
    if (ec != 0)
      ec->clear();
    BOOST_ASSERT_MSG(result.is_absolute(), "canonical() implementation error; please report");
    return result;
  }